

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

Expression * __thiscall CFG::Block::Render(Block *this,RelooperBuilder *Builder,bool InLoop)

{
  ExpressionList *this_00;
  undefined8 *puVar1;
  uint uVar2;
  _func_int **pp_Var3;
  _List_node_base *p_Var4;
  Name name;
  Name default_;
  BlockBranchMap *pBVar5;
  bool bVar6;
  bool bVar7;
  Name *Value;
  LocalSet *item;
  Block *pBVar8;
  iterator iVar9;
  Expression *pEVar10;
  Break *item_00;
  undefined1 auVar11 [8];
  Switch *item_01;
  Branch **ppBVar12;
  Block *any;
  Block *pBVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  _List_node_base *p_Var15;
  Branch *pBVar16;
  _Self __tmp;
  _List_node_base *p_Var17;
  undefined1 SetLabel;
  Shape *pSVar18;
  string local_1a8;
  IString local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  char *local_138;
  char *pcStack_130;
  undefined1 auStack_128 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> Table;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> Base;
  Name SwitchLeave;
  Name SwitchDefault;
  map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  BlockNameMap;
  Block *local_88;
  Block *DefaultTarget;
  uint local_74;
  Shape *local_70;
  _List_node_base *local_68;
  undefined4 local_5c;
  Block *local_58;
  Block *local_50;
  _List_node_base *local_48;
  RelooperBuilder *local_40;
  bool local_31;
  
  local_40 = Builder;
  DefaultTarget =
       (Block *)MixedArena::alloc<wasm::Block>(&((Builder->super_Builder).wasm)->allocator);
  uVar14 = extraout_RDX;
  if ((this->IsCheckedMultipleEntry & InLoop) == 1) {
    pBVar5 = &DefaultTarget->BranchesOut;
    item = RelooperBuilder::makeSetLabel(local_40,0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &(pBVar5->Map)._M_h._M_element_count,(Expression *)item);
    uVar14 = extraout_RDX_00;
  }
  if (this->Code != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &(DefaultTarget->BranchesOut).Map._M_h._M_element_count,this->Code);
    uVar14 = extraout_RDX_01;
  }
  pp_Var3 = (_func_int **)(this->ProcessedBranchesOut).Map._M_h._M_element_count;
  pBVar13 = DefaultTarget;
  if (pp_Var3 == (_func_int **)0x0) goto LAB_00afed63;
  pSVar18 = this->Parent->Next;
  local_5c = (undefined4)CONCAT71((int7)((ulong)uVar14 >> 8),1);
  if ((pSVar18 == (Shape *)0x0) || (pSVar18->Type != Multiple)) {
    pSVar18 = (Shape *)0x0;
    local_31 = true;
  }
  else {
    this->Parent->Next = pSVar18->Next;
    local_31 = pp_Var3 != pSVar18[2]._vptr_Shape || this->SwitchCondition != (Expression *)0x0;
    local_5c = 0;
  }
  local_88 = (Block *)0x0;
  local_68 = (_List_node_base *)&(this->ProcessedBranchesOut).List;
  pBVar13 = (Block *)0x0;
  p_Var17 = (this->ProcessedBranchesOut).List.
            super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  for (p_Var15 = p_Var17; p_Var15 != local_68; p_Var15 = p_Var15->_M_next) {
    if (this->SwitchCondition == (Expression *)0x0) {
      p_Var4 = p_Var15[1]._M_prev[1]._M_next;
    }
    else {
      p_Var4 = p_Var15[1]._M_prev[1]._M_prev;
    }
    if (p_Var4 == (_List_node_base *)0x0) {
      if (pBVar13 != (Block *)0x0) {
        __assert_fail("!DefaultTarget && \"block has branches without a default (nullptr for the \" \"condition)\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0xe4,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
      pBVar13 = (Block *)p_Var15[1]._M_next;
      local_88 = pBVar13;
    }
  }
  if (pBVar13 == (Block *)0x0) {
    __assert_fail("DefaultTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                  ,0xe9,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
  }
  local_74 = (uint)InLoop;
  if (this->SwitchCondition == (Expression *)0x0) {
    SwitchDefault.super_IString.str._M_str = (char *)0x0;
    BlockNameMap._M_t._M_impl._0_8_ = 0;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_70 = pSVar18 + 1;
    pBVar8 = (Block *)0x0;
    auVar11 = (undefined1  [8])0x0;
    local_58 = (Block *)0x0;
LAB_00afeb05:
    pBVar13 = local_88;
    local_50 = pBVar8;
    if (p_Var17 != local_68) {
      pBVar13 = (Block *)p_Var17[1]._M_next;
      if (pBVar13 != local_88) {
        pBVar16 = (Branch *)p_Var17[1]._M_prev;
        if (pBVar16->Condition == (Expression *)0x0) {
          __assert_fail("Details->Condition",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                        ,0x102,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
        }
        goto LAB_00afeb48;
      }
      goto LAB_00afecad;
    }
    ppBVar12 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                         (&this->ProcessedBranchesOut,&local_88);
    pBVar16 = *ppBVar12;
LAB_00afeb48:
    if (local_31 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = pBVar13->IsCheckedMultipleEntry;
    }
    local_48 = p_Var17;
    if (((char)local_5c == '\0') &&
       (bVar7 = contains<std::map<int,CFG::Shape*,std::less<int>,std::allocator<std::pair<int_const,CFG::Shape*>>>,int>
                          ((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                            *)local_70,&pBVar13->Id), bVar7)) {
      if (pBVar16->Type != Break) {
        __assert_fail("Details->Type == Branch::Break",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x10a,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
      pBVar16->Type = Direct;
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
    if (((bVar6 != false) || (pBVar16->Type != Direct || bVar7)) ||
       (pBVar16->Code != (Expression *)0x0)) {
      any = (Block *)Branch::Render(pBVar16,local_40,pBVar13,bVar6);
      if (bVar7) {
        iVar9 = std::
                _Rb_tree<int,_std::pair<const_int,_CFG::Shape_*>,_std::_Select1st<std::pair<const_int,_CFG::Shape_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_CFG::Shape_*>,_std::_Select1st<std::pair<const_int,_CFG::Shape_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                        *)local_70,&pBVar13->Id);
        pEVar10 = (Expression *)
                  (**(code **)(*(long *)iVar9._M_node[1]._M_parent + 0x10))
                            (iVar9._M_node[1]._M_parent,local_40,local_74);
        any = ::wasm::Builder::blockify(&local_40->super_Builder,(Expression *)any,pEVar10);
      }
      if (any != (Block *)0x0) {
        if (local_48 != local_68) {
          local_108 = (undefined1  [8])
                      ::wasm::Builder::makeIf
                                (&local_40->super_Builder,pBVar16->Condition,(Expression *)any,
                                 (Expression *)0x0);
          p_Var17 = local_48;
          std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
                    ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)
                     &SwitchDefault.super_IString.str._M_str,(value_type *)local_108);
          if (auVar11 == (undefined1  [8])0x0) {
            if (local_58 != (Block *)0x0) {
              __assert_fail("!Root",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                            ,0x12d,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
            }
            local_58 = (Block *)local_108;
            pBVar8 = local_50;
            auVar11 = local_108;
          }
          else {
            (((Block *)auVar11)->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
                 (Expression **)local_108;
            ::wasm::If::finalize((If *)auVar11);
            pBVar8 = local_50;
            auVar11 = local_108;
          }
          goto LAB_00afecad;
        }
        if (local_50 != (Block *)0x0) {
          any = (Block *)::wasm::Builder::makeIf
                                   (&local_40->super_Builder,(Expression *)local_50,
                                    (Expression *)any,(Expression *)0x0);
          local_108 = (undefined1  [8])::wasm::Expression::cast<wasm::If>((Expression *)any);
          std::vector<wasm::If*,std::allocator<wasm::If*>>::emplace_back<wasm::If*>
                    ((vector<wasm::If*,std::allocator<wasm::If*>> *)
                     &SwitchDefault.super_IString.str._M_str,(If **)local_108);
        }
        if (auVar11 == (undefined1  [8])0x0) {
          bVar6 = local_58 != (Block *)0x0;
          local_58 = any;
          if (bVar6) {
            __assert_fail("!Root",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                          ,0x123,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
          }
        }
        else {
          (((Block *)auVar11)->list).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
               (Expression **)any;
          ::wasm::If::finalize((If *)auVar11);
          any = local_58;
        }
LAB_00afed16:
        while ((char *)BlockNameMap._M_t._M_impl._0_8_ != SwitchDefault.super_IString.str._M_str) {
          puVar1 = (undefined8 *)(BlockNameMap._M_t._M_impl._0_8_ + -8);
          BlockNameMap._M_t._M_impl._0_8_ = BlockNameMap._M_t._M_impl._0_8_ + -8;
          ::wasm::If::finalize((If *)*puVar1);
        }
        std::_Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>::~_Vector_base
                  ((_Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_> *)
                   &SwitchDefault.super_IString.str._M_str);
        pBVar13 = DefaultTarget;
        if (any == (Block *)0x0) goto LAB_00afed63;
        goto LAB_00afed51;
      }
    }
    pBVar8 = (Block *)::wasm::Builder::makeUnary
                                (&local_40->super_Builder,EqZInt32,pBVar16->Condition);
    p_Var17 = local_48;
    if (local_50 != (Block *)0x0) {
      pBVar8 = (Block *)::wasm::Builder::makeBinary
                                  (&local_40->super_Builder,AndInt32,(Expression *)local_50,
                                   (Expression *)pBVar8);
    }
    any = local_58;
    if (p_Var17 == local_68) goto LAB_00afed16;
LAB_00afecad:
    p_Var17 = (((_List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
                 *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    goto LAB_00afeb05;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SwitchDefault.super_IString.str._M_str,"switch$",
             (allocator<char> *)&local_178);
  std::__cxx11::to_string(&local_158,this->Id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &SwitchDefault.super_IString.str._M_str,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&SwitchDefault.super_IString.str._M_str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &SwitchDefault.super_IString.str._M_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 "$default");
  ::wasm::IString::IString
            ((IString *)&SwitchLeave.super_IString.str._M_str,
             (string *)&SwitchDefault.super_IString.str._M_str);
  std::__cxx11::string::~string((string *)&SwitchDefault.super_IString.str._M_str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &SwitchDefault.super_IString.str._M_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 "$leave");
  ::wasm::IString::IString
            ((IString *)((long)&Base.field_2 + 8),(string *)&SwitchDefault.super_IString.str._M_str)
  ;
  std::__cxx11::string::~string((string *)&SwitchDefault.super_IString.str._M_str);
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&BlockNameMap;
  BlockNameMap._M_t._M_impl._0_8_ = (ulong)(uint)BlockNameMap._M_t._M_impl._4_4_ << 0x20;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_58 = MixedArena::alloc<wasm::Block>(&((local_40->super_Builder).wasm)->allocator);
  Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_128 = (undefined1  [8])0x0;
  Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_70 = pSVar18 + 1;
  local_48 = local_68;
  any = local_58;
  while( true ) {
    p_Var17 = local_48->_M_next;
    if (p_Var17 == local_68) break;
    local_48 = p_Var17;
    if (p_Var17[1]._M_prev[1]._M_prev == (_List_node_base *)0x0) {
      local_138 = SwitchLeave.super_IString.str._M_str;
      pcStack_130 = (char *)SwitchDefault.super_IString.str._M_len;
    }
    else {
      std::operator+(&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "$case$");
      std::__cxx11::to_string(&local_1a8,*(int *)((long)local_48[1]._M_next + 0x150));
      std::operator+(&local_158,&local_178,&local_1a8);
      ::wasm::IString::IString(&local_188,&local_158);
      local_138 = (char *)local_188.str._M_len;
      pcStack_130 = local_188.str._M_str;
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_178);
    }
    p_Var17 = local_48;
    if (local_31 == false) {
      SetLabel = false;
    }
    else {
      SetLabel = *(undefined1 *)((long)local_48[1]._M_next + 0x168);
    }
    if ((char)local_5c == '\0') {
      bVar6 = contains<std::map<int,CFG::Shape*,std::less<int>,std::allocator<std::pair<int_const,CFG::Shape*>>>,int>
                        ((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                          *)local_70,(int *)((long)local_48[1]._M_next + 0x150));
      pBVar16 = (Branch *)p_Var17[1]._M_prev;
      if (!bVar6) goto LAB_00afe891;
      if (pBVar16->Type != 1) {
        __assert_fail("Details->Type == Branch::Break",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x15e,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
      pBVar16->Type = 0;
      bVar6 = true;
    }
    else {
      pBVar16 = (Branch *)local_48[1]._M_prev;
LAB_00afe891:
      bVar6 = false;
    }
    if ((((bool)SetLabel != false) || (pBVar16->Type != Direct || bVar6)) ||
       (pBVar16->Code != (Expression *)0x0)) {
      pBVar8 = (Block *)Branch::Render(pBVar16,local_40,(Block *)local_48[1]._M_next,(bool)SetLabel)
      ;
      if (bVar6) {
        iVar9 = std::
                _Rb_tree<int,_std::pair<const_int,_CFG::Shape_*>,_std::_Select1st<std::pair<const_int,_CFG::Shape_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_CFG::Shape_*>,_std::_Select1st<std::pair<const_int,_CFG::Shape_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                        *)local_70,(key_type_conflict1 *)((long)local_48[1]._M_next + 0x150));
        pEVar10 = (Expression *)
                  (**(code **)(*(long *)iVar9._M_node[1]._M_parent + 0x10))
                            (iVar9._M_node[1]._M_parent,local_40,local_74);
        pBVar8 = ::wasm::Builder::blockify(&local_40->super_Builder,(Expression *)pBVar8,pEVar10);
      }
      if (pBVar8 == (Block *)0x0) {
        pBVar16 = (Branch *)local_48[1]._M_prev;
        goto LAB_00afe98c;
      }
      local_50 = MixedArena::alloc<wasm::Block>(&((local_40->super_Builder).wasm)->allocator);
      this_00 = &local_50->list;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_00->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)any);
      (any->name).super_IString.str._M_len = (size_t)local_138;
      (any->name).super_IString.str._M_str = pcStack_130;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_00->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar8);
      if ((pBVar8->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 1)
      {
        name.super_IString.str._M_str = (char *)SwitchLeave.super_IString.str._M_len;
        name.super_IString.str._M_len = Base.field_2._8_8_;
        item_00 = ::wasm::Builder::makeBreak
                            (&local_40->super_Builder,name,(Expression *)0x0,(Expression *)0x0);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)item_00);
      }
    }
    else {
LAB_00afe98c:
      local_138 = (char *)Base.field_2._8_8_;
      pcStack_130 = (char *)SwitchLeave.super_IString.str._M_len;
      auVar11 = auStack_128;
      local_50 = any;
      if ((pBVar16->SwitchValues)._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        for (; auVar11 !=
               (undefined1  [8])
               Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start; auVar11 = (undefined1  [8])((long)auVar11 + 0x10))
        {
          if ((((pointer)auVar11)->super_IString).str._M_str ==
              (char *)SwitchDefault.super_IString.str._M_len) {
            (((pointer)auVar11)->super_IString).str._M_len = Base.field_2._8_8_;
            (((pointer)auVar11)->super_IString).str._M_str =
                 (char *)SwitchLeave.super_IString.str._M_len;
          }
        }
        SwitchLeave.super_IString.str._M_str = (char *)Base.field_2._8_8_;
        SwitchDefault.super_IString.str._M_len = SwitchLeave.super_IString.str._M_len;
      }
    }
    p_Var17 = local_48[1]._M_prev[1]._M_prev;
    any = local_50;
    if (p_Var17 != (_List_node_base *)0x0) {
      p_Var15 = p_Var17->_M_prev;
      for (p_Var17 = p_Var17->_M_next; any = local_50, p_Var17 != p_Var15;
          p_Var17 = (_List_node_base *)((long)&p_Var17->_M_next + 4)) {
        uVar2 = *(uint *)&p_Var17->_M_next;
        while ((ulong)((long)Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)auStack_128 >> 4) <=
               (ulong)uVar2) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_128,
                     (value_type *)&SwitchLeave.super_IString.str._M_str);
        }
        (((pointer)((long)auStack_128 + (ulong)uVar2 * 0x10))->super_IString).str._M_len =
             (size_t)local_138;
        (((pointer)((long)auStack_128 + (ulong)uVar2 * 0x10))->super_IString).str._M_str =
             pcStack_130;
      }
    }
  }
  (any->name).super_IString.str._M_len = Base.field_2._8_8_;
  (any->name).super_IString.str._M_str = (char *)SwitchLeave.super_IString.str._M_len;
  default_.super_IString.str._M_str = (char *)SwitchDefault.super_IString.str._M_len;
  default_.super_IString.str._M_len = (size_t)SwitchLeave.super_IString.str._M_str;
  item_01 = ::wasm::Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                      (&local_40->super_Builder,
                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_128,default_,
                       this->SwitchCondition,(Expression *)0x0);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(local_58->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item_01);
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_128);
  std::
  _Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_wasm::Name>,_std::_Select1st<std::pair<CFG::Block_*const,_wasm::Name>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_wasm::Name>,_std::_Select1st<std::pair<CFG::Block_*const,_wasm::Name>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
               *)&SwitchDefault.super_IString.str._M_str);
  std::__cxx11::string::~string((string *)local_108);
LAB_00afed51:
  pBVar13 = DefaultTarget;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &(DefaultTarget->BranchesOut).Map._M_h._M_element_count,(Expression *)any);
LAB_00afed63:
  ::wasm::Block::finalize((Block *)pBVar13);
  return (Expression *)pBVar13;
}

Assistant:

wasm::Expression* Block::Render(RelooperBuilder& Builder, bool InLoop) {
  auto* Ret = Builder.makeBlock();
  if (IsCheckedMultipleEntry && InLoop) {
    Ret->list.push_back(Builder.makeSetLabel(0));
  }
  if (Code) {
    Ret->list.push_back(Code);
  }

  if (!ProcessedBranchesOut.size()) {
    Ret->finalize();
    return Ret;
  }

  // in some cases it is clear we can avoid setting label, see later
  bool SetLabel = true;

  // A setting of the label variable (label = x) is necessary if it can
  // cause an impact. The main case is where we set label to x, then elsewhere
  // we check if label is equal to that value, i.e., that label is an entry
  // in a multiple block. We also need to reset the label when we enter
  // that block, so that each setting is a one-time action: consider
  //
  //    while (1) {
  //      if (check) label = 1;
  //      if (label == 1) { label = 0 }
  //    }
  //
  // (Note that this case is impossible due to fusing, but that is not
  // material here.) So setting to 0 is important just to clear the 1 for
  // future iterations.
  // TODO: When inside a loop, if necessary clear the label variable
  //       once on the top, and never do settings that are in effect clears

  // Fusing: If the next is a Multiple, we can fuse it with this block. Note
  // that we must be the Inner of a Simple, so fusing means joining a Simple
  // to a Multiple. What happens there is that all options in the Multiple
  // *must* appear in the Simple (the Simple is the only one reaching the
  // Multiple), so we can remove the Multiple and add its independent groups
  // into the Simple's branches.
  MultipleShape* Fused = Shape::IsMultiple(Parent->Next);
  if (Fused) {
    PrintDebug("Fusing Multiple to Simple\n", 0);
    Parent->Next = Parent->Next->Next;
    // When the Multiple has the same number of groups as we have branches,
    // they will all be fused, so it is safe to not set the label at all.
    // If a switch, then we can have multiple branches to the same target
    // (in different table indexes), and so this check is not sufficient
    // TODO: optimize
    if (SetLabel && Fused->InnerMap.size() == ProcessedBranchesOut.size() &&
        !SwitchCondition) {
      SetLabel = false;
    }
  }

  // The block we branch to without checking the condition, if none of the other
  // conditions held.
  Block* DefaultTarget = nullptr;

  // Find the default target, the one without a condition
  for (auto& [Target, Details] : ProcessedBranchesOut) {
    if ((!SwitchCondition && !Details->Condition) ||
        (SwitchCondition && !Details->SwitchValues)) {
      assert(!DefaultTarget &&
             "block has branches without a default (nullptr for the "
             "condition)"); // Must be exactly one default // nullptr
      DefaultTarget = Target;
    }
  }
  // Since each Block* must* branch somewhere, this must be set
  assert(DefaultTarget);

  // root of the main part, that we are about to emit
  wasm::Expression* Root = nullptr;

  if (!SwitchCondition) {
    // We'll emit a chain of if-elses
    wasm::If* CurrIf = nullptr;

    // we build an if, then add a child, then add a child to that, etc., so we
    // must finalize them in reverse order
    std::vector<wasm::If*> finalizeStack;

    wasm::Expression* RemainingConditions = nullptr;

    for (auto iter = ProcessedBranchesOut.begin();; iter++) {
      Block* Target;
      Branch* Details;
      if (iter != ProcessedBranchesOut.end()) {
        Target = iter->first;
        if (Target == DefaultTarget) {
          continue; // done at the end
        }
        Details = iter->second;
        // must have a condition if this is not the default target
        assert(Details->Condition);
      } else {
        Target = DefaultTarget;
        Details = ProcessedBranchesOut[DefaultTarget];
      }
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      bool IsDefault = iter == ProcessedBranchesOut.end();
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // If there is nothing to show in this branch, omit the condition
      if (CurrContent) {
        if (IsDefault) {
          wasm::Expression* Now;
          if (RemainingConditions) {
            Now = Builder.makeIf(RemainingConditions, CurrContent);
            finalizeStack.push_back(Now->cast<wasm::If>());
          } else {
            Now = CurrContent;
          }
          if (!CurrIf) {
            assert(!Root);
            Root = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
          }
        } else {
          auto* Now = Builder.makeIf(Details->Condition, CurrContent);
          finalizeStack.push_back(Now);
          if (!CurrIf) {
            assert(!Root);
            Root = CurrIf = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
            CurrIf = Now;
          }
        }
      } else {
        auto* Now = Builder.makeUnary(wasm::EqZInt32, Details->Condition);
        if (RemainingConditions) {
          RemainingConditions =
            Builder.makeBinary(wasm::AndInt32, RemainingConditions, Now);
        } else {
          RemainingConditions = Now;
        }
      }
      if (IsDefault) {
        break;
      }
    }

    // finalize the if-chains
    while (finalizeStack.size() > 0) {
      wasm::If* curr = finalizeStack.back();
      finalizeStack.pop_back();
      curr->finalize();
    }

  } else {
    // Emit a switch
    auto Base = std::string("switch$") + std::to_string(Id);
    auto SwitchDefault = wasm::Name(Base + "$default");
    auto SwitchLeave = wasm::Name(Base + "$leave");
    std::map<Block*, wasm::Name> BlockNameMap;
    auto* Outer = Builder.makeBlock();
    auto* Inner = Outer;
    std::vector<wasm::Name> Table;
    for (auto& [Target, Details] : ProcessedBranchesOut) {
      wasm::Name CurrName;
      if (Details->SwitchValues) {
        CurrName = wasm::Name(Base + "$case$" + std::to_string(Target->Id));
      } else {
        CurrName = SwitchDefault;
      }
      // generate the content for this block
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // generate a block to branch to, if we have content
      if (CurrContent) {
        auto* NextOuter = Builder.makeBlock();
        NextOuter->list.push_back(Outer);
        // breaking on Outer leads to the content in NextOuter
        Outer->name = CurrName;
        NextOuter->list.push_back(CurrContent);
        // if this is not a dead end, also need to break to the outside this is
        // both an optimization, and avoids incorrectness as adding a break in
        // unreachable code can make a place look reachable that isn't
        if (CurrContent->type != wasm::Type::unreachable) {
          NextOuter->list.push_back(Builder.makeBreak(SwitchLeave));
        }
        // prepare for more nesting
        Outer = NextOuter;
      } else {
        CurrName = SwitchLeave; // just go out straight from the table
        if (!Details->SwitchValues) {
          // this is the default, and it has no content. So make the default be
          // the leave
          for (auto& Value : Table) {
            if (Value == SwitchDefault) {
              Value = SwitchLeave;
            }
          }
          SwitchDefault = SwitchLeave;
        }
      }
      if (Details->SwitchValues) {
        for (auto Value : *Details->SwitchValues) {
          while (Table.size() <= Value) {
            Table.push_back(SwitchDefault);
          }
          Table[Value] = CurrName;
        }
      }
    }
    // finish up the whole pattern
    Outer->name = SwitchLeave;
    Inner->list.push_back(
      Builder.makeSwitch(Table, SwitchDefault, SwitchCondition));
    Root = Outer;
  }

  if (Root) {
    Ret->list.push_back(Root);
  }
  Ret->finalize();

  return Ret;
}